

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_nearest_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _v;
  int i;
  int *offset_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_408;
  undefined8 uStack_400;
  int local_364;
  int *local_318;
  undefined8 *local_2c8;
  int local_270;
  
  lVar6 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar7 = in_RSI[6];
  iVar2 = *(int *)((long)in_RSI + 0x34);
  for (local_270 = 0; local_270 < (int)lVar6; local_270 = local_270 + 1) {
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    local_2c8 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_270 * in_RSI[2]);
    local_318 = (int *)*in_RDX;
    for (local_364 = 0; local_364 < iVar1 * (int)lVar7 * iVar2; local_364 = local_364 + 1) {
      if (*local_318 < 0) {
        local_408 = 0;
        uStack_400 = 0;
      }
      else {
        puVar8 = (undefined8 *)(lVar3 + lVar4 * local_270 * lVar5 + (long)*local_318 * 4);
        local_408 = *puVar8;
        uStack_400 = puVar8[1];
      }
      local_318 = local_318 + 1;
      *local_2c8 = local_408;
      local_2c8[1] = uStack_400;
      local_2c8 = local_2c8 + 2;
    }
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m128 _v = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            offset_ptr++;

            _mm_storeu_ps(dstptr, _v);
            dstptr += 4;
        }
    }
}